

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

UA_UInt16 addNamespace(UA_Server *server,UA_String name)

{
  ulong uVar1;
  UA_String *__ptr;
  int iVar2;
  UA_StatusCode UVar3;
  ulong uVar4;
  void *pvVar5;
  UA_Byte *pUVar6;
  size_t __n;
  ulong uVar7;
  size_t local_48;
  UA_String name_local;
  
  pUVar6 = name.data;
  __n = name.length;
  uVar1 = server->namespacesSize;
  __ptr = server->namespaces;
  local_48 = __n;
  name_local.length = (size_t)pUVar6;
  name_local.data = (UA_Byte *)server;
  if (uVar1 != 0) {
    uVar4 = 0;
    uVar7 = 0;
    do {
      if (__ptr[uVar4].length == __n) {
        iVar2 = bcmp(pUVar6,__ptr[uVar4].data,__n);
        if (iVar2 == 0) goto LAB_0011516f;
      }
      uVar7 = (ulong)((int)uVar7 + 1);
      uVar4 = uVar7 & 0xffff;
    } while (uVar4 < uVar1);
  }
  pvVar5 = realloc(__ptr,uVar1 * 0x10 + 0x10);
  pUVar6 = name_local.data;
  if (pvVar5 != (void *)0x0) {
    *(void **)(name_local.data + 0x60) = pvVar5;
    UVar3 = UA_copy(&local_48,(void *)(*(long *)(name_local.data + 0x58) * 0x10 + (long)pvVar5),
                    UA_TYPES + 0xb);
    if (UVar3 == 0) {
      uVar7 = *(ulong *)(pUVar6 + 0x58);
      *(ulong *)(pUVar6 + 0x58) = uVar7 + 1;
      goto LAB_0011516f;
    }
  }
  uVar7 = 0;
LAB_0011516f:
  return (UA_UInt16)uVar7;
}

Assistant:

UA_UInt16 addNamespace(UA_Server *server, const UA_String name) {
    /* Check if the namespace already exists in the server's namespace array */
    for(UA_UInt16 i=0;i<server->namespacesSize;++i) {
        if(UA_String_equal(&name, &server->namespaces[i]))
            return i;
    }

    /* Add a new namespace to the namsepace array */
    UA_String *newNS = UA_realloc(server->namespaces,
                                  sizeof(UA_String) * (server->namespacesSize + 1));
    if(!newNS)
        return 0;
    server->namespaces = newNS;
    UA_StatusCode retval = UA_String_copy(&name, &server->namespaces[server->namespacesSize]);
    if(retval != UA_STATUSCODE_GOOD)
        return 0;
    ++server->namespacesSize;
    return (UA_UInt16)(server->namespacesSize - 1);
}